

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

tuple<long,_double,_double> * __thiscall
fasttext::FastText::test
          (tuple<long,_double,_double> *__return_storage_ptr__,FastText *this,istream *in,int32_t k,
          real threshold)

{
  undefined8 uVar1;
  double dVar2;
  double dVar3;
  Meter meter;
  undefined1 local_88 [32];
  undefined1 local_68 [24];
  undefined1 *puStack_50;
  undefined1 local_48 [24];
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined1 local_28 [16];
  
  local_88 = ZEXT1632(ZEXT816(0) << 0x40);
  local_68._16_8_ = 0;
  local_68._0_16_ = ZEXT816(0) << 0x40;
  puStack_50 = local_28 + 8;
  local_28 = ZEXT416(0) << 0x40;
  local_48._8_16_ = local_28;
  local_48._0_8_ = 1;
  uStack_30 = 0x3f800000;
  uStack_2c = 0;
  test(this,in,k,threshold,(Meter *)local_88);
  uVar1 = local_68._16_8_;
  dVar2 = Meter::precision((Meter *)local_88);
  dVar3 = Meter::recall((Meter *)local_88);
  (__return_storage_ptr__->super__Tuple_impl<0UL,_long,_double,_double>).
  super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double>.
  super__Head_base<2UL,_double,_false>._M_head_impl = dVar3;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_long,_double,_double>).
  super__Tuple_impl<1UL,_double,_double>.super__Head_base<1UL,_double,_false>._M_head_impl = dVar2;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_long,_double,_double>).
  super__Head_base<0UL,_long,_false>._M_head_impl = uVar1;
  Meter::~Meter((Meter *)local_88);
  return __return_storage_ptr__;
}

Assistant:

std::tuple<int64_t, double, double>
FastText::test(std::istream& in, int32_t k, real threshold) {
  Meter meter;
  test(in, k, threshold, meter);

  return std::tuple<int64_t, double, double>(
      meter.nexamples(), meter.precision(), meter.recall());
}